

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::ScatterLayerParams::MergePartialFromCodedStream
          (ScatterLayerParams *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  uint8 *puVar3;
  bool bVar4;
  uint32 uVar5;
  uint uVar6;
  unsigned_long uVar7;
  ulong uVar8;
  pair<unsigned_long,_bool> pVar9;
  
LAB_001382a9:
  do {
    pbVar2 = input->buffer_;
    uVar5 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar5 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_001382cc;
      input->buffer_ = pbVar2 + 1;
      uVar8 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_001382cc:
      uVar5 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar5);
      uVar8 = 0;
      if (uVar5 - 1 < 0x7f) {
        uVar8 = 0x100000000;
      }
      uVar8 = uVar5 | uVar8;
    }
    uVar5 = (uint32)uVar8;
    if ((uVar8 & 0x100000000) != 0) {
      uVar6 = (uint)(uVar8 >> 3) & 0x1fffffff;
      if (uVar6 == 2) {
        if ((char)uVar8 == '\x10') {
          pbVar2 = input->buffer_;
          if (pbVar2 < input->buffer_end_) {
            bVar1 = *pbVar2;
            uVar8 = (ulong)bVar1;
            uVar5 = (uint32)bVar1;
            if ((char)bVar1 < '\0') goto LAB_00138374;
            input->buffer_ = pbVar2 + 1;
          }
          else {
            uVar5 = 0;
LAB_00138374:
            uVar8 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
            if ((long)uVar8 < 0) {
              return false;
            }
          }
          this->mode_ = (int)uVar8;
          goto LAB_001382a9;
        }
      }
      else if ((uVar6 == 1) && ((char)uVar8 == '\b')) {
        puVar3 = input->buffer_;
        if ((puVar3 < input->buffer_end_) &&
           (uVar7 = (unsigned_long)(char)*puVar3, -1 < (long)uVar7)) {
          input->buffer_ = puVar3 + 1;
        }
        else {
          pVar9 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
          uVar7 = pVar9.first;
          if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            return false;
          }
        }
        this->axis_ = uVar7;
        goto LAB_001382a9;
      }
    }
    if (uVar5 == 0) {
      return true;
    }
    if ((uVar5 & 7) == 4) {
      return true;
    }
    bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar5);
    if (!bVar4) {
      return false;
    }
  } while( true );
}

Assistant:

bool ScatterLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.ScatterLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // int64 axis = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, &axis_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ScatterMode mode = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          set_mode(static_cast< ::CoreML::Specification::ScatterMode >(value));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.ScatterLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.ScatterLayerParams)
  return false;
#undef DO_
}